

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

int uv_os_uname(uv_utsname_t *buffer)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  utsname buf;
  utsname local_19e;
  
  if (buffer == (uv_utsname_t *)0x0) {
    return -0x16;
  }
  iVar1 = uname(&local_19e);
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    iVar1 = -*piVar3;
  }
  else {
    sVar2 = uv__strscpy(buffer->sysname,local_19e.sysname,0x100);
    iVar1 = -7;
    if (((((int)sVar2 != -7) &&
         (sVar2 = uv__strscpy(buffer->release,local_19e.release,0x100), (int)sVar2 != -7)) &&
        (sVar2 = uv__strscpy(buffer->version,local_19e.version,0x100), (int)sVar2 != -7)) &&
       (sVar2 = uv__strscpy(buffer->machine,local_19e.machine,0x100), (int)sVar2 != -7)) {
      return 0;
    }
  }
  buffer->sysname[0] = '\0';
  buffer->release[0] = '\0';
  buffer->version[0] = '\0';
  buffer->machine[0] = '\0';
  return iVar1;
}

Assistant:

int uv_os_uname(uv_utsname_t* buffer) {
  struct utsname buf;
  int r;

  if (buffer == NULL)
    return UV_EINVAL;

  if (uname(&buf) == -1) {
    r = UV__ERR(errno);
    goto error;
  }

  r = uv__strscpy(buffer->sysname, buf.sysname, sizeof(buffer->sysname));
  if (r == UV_E2BIG)
    goto error;

#ifdef _AIX
  r = snprintf(buffer->release,
               sizeof(buffer->release),
               "%s.%s",
               buf.version,
               buf.release);
  if (r >= sizeof(buffer->release)) {
    r = UV_E2BIG;
    goto error;
  }
#else
  r = uv__strscpy(buffer->release, buf.release, sizeof(buffer->release));
  if (r == UV_E2BIG)
    goto error;
#endif

  r = uv__strscpy(buffer->version, buf.version, sizeof(buffer->version));
  if (r == UV_E2BIG)
    goto error;

#if defined(_AIX) || defined(__PASE__)
  r = uv__strscpy(buffer->machine, "ppc64", sizeof(buffer->machine));
#else
  r = uv__strscpy(buffer->machine, buf.machine, sizeof(buffer->machine));
#endif

  if (r == UV_E2BIG)
    goto error;

  return 0;

error:
  buffer->sysname[0] = '\0';
  buffer->release[0] = '\0';
  buffer->version[0] = '\0';
  buffer->machine[0] = '\0';
  return r;
}